

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdMovMult(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  RegVmCopyType copyType_2;
  uchar lhs_2;
  uchar rhs_2;
  RegVmCopyType copyType_1;
  uchar lhs_1;
  uchar rhs_1;
  RegVmCopyType copyType;
  uchar lhs;
  uchar rhs;
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx_local._1_1_ = cmd.rA;
  ctx_local._3_1_ = cmd.rC;
  if (ctx_local._1_1_ != ctx_local._3_1_) {
    ctx_local._2_1_ = cmd.rB;
    GetCodeCmdMovHelper(ctx,ctx_local._1_1_,ctx_local._3_1_,ctx_local._2_1_ & rvcLong);
    ctx_local._4_4_ = cmd.argument;
    if ((ctx_local._4_4_ >> 0x10 & 0xff) != ctx_local._4_4_ >> 0x18) {
      GetCodeCmdMovHelper(ctx,cmd.argument._3_1_,cmd.argument._2_1_,
                          (int)(uint)ctx_local._2_1_ >> 2 & rvcLong);
    }
    if ((ctx_local._4_4_ & 0xff) != (ctx_local._4_4_ >> 8 & 0xff)) {
      GetCodeCmdMovHelper(ctx,cmd.argument._1_1_,(uchar)cmd.argument,
                          (int)(uint)ctx_local._2_1_ >> 4 & rvcLong);
    }
    return;
  }
  __assert_fail("cmd.rA != cmd.rC",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGenRegVm_X86.cpp"
                ,0x4c9,"void GenCodeCmdMovMult(CodeGenRegVmContext &, RegVmCmd)");
}

Assistant:

void GenCodeCmdMovMult(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	assert(cmd.rA != cmd.rC);

	{
		unsigned char rhs = cmd.rC;
		unsigned char lhs = cmd.rA;
		RegVmCopyType copyType = RegVmCopyType(cmd.rB & 0x3);

		GetCodeCmdMovHelper(ctx, lhs, rhs, copyType);
	}

	if(((cmd.argument >> 16) & 0xff) != (cmd.argument >> 24))
	{
		unsigned char rhs = ((cmd.argument >> 16) & 0xff);
		unsigned char lhs = (cmd.argument >> 24);
		RegVmCopyType copyType = RegVmCopyType((cmd.rB >> 2) & 0x3);

		GetCodeCmdMovHelper(ctx, lhs, rhs, copyType);
	}

	if((cmd.argument & 0xff) != ((cmd.argument >> 8) & 0xff))
	{
		unsigned char rhs = (cmd.argument & 0xff);
		unsigned char lhs = ((cmd.argument >> 8) & 0xff);
		RegVmCopyType copyType = RegVmCopyType((cmd.rB >> 4) & 0x3);

		GetCodeCmdMovHelper(ctx, lhs, rhs, copyType);
	}
}